

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

char * ident_val_add_module_prefix(char *value,lyxml_elem *xml,ly_ctx *ctx)

{
  int iVar1;
  char *local_40;
  char *str;
  lys_module *mod;
  lyxml_ns *ns;
  ly_ctx *ctx_local;
  lyxml_elem *xml_local;
  char *value_local;
  
  ctx_local = (ly_ctx *)xml;
  do {
    for (mod = *(lys_module **)((long)&(ctx_local->dict).lock + 8);
        (mod != (lys_module *)0x0 && ((*(int *)&mod->ctx != 2 || (mod->dsc != (char *)0x0))));
        mod = (lys_module *)mod->name) {
    }
    if (mod == (lys_module *)0x0) {
      ctx_local = (ly_ctx *)(ctx_local->dict).lock.__align;
    }
  } while (mod == (lys_module *)0x0 && ctx_local != (ly_ctx *)0x0);
  ns = (lyxml_ns *)ctx;
  xml_local = (lyxml_elem *)value;
  if (mod == (lys_module *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
           ,0x494);
    value_local = (char *)0x0;
  }
  else {
    str = (char *)ly_ctx_get_module_by_ns(ctx,mod->ref,(char *)0x0,1);
    if ((lys_module *)str == (lys_module *)0x0) {
      ly_log((ly_ctx *)ns,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
             ,0x49b);
      value_local = (char *)0x0;
    }
    else {
      iVar1 = asprintf(&local_40,"%s:%s",((lys_module *)str)->name,xml_local);
      if (iVar1 == -1) {
        ly_log((ly_ctx *)ns,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "ident_val_add_module_prefix");
        value_local = (char *)0x0;
      }
      else {
        lydict_remove((ly_ctx *)ns,&xml_local->flags);
        value_local = lydict_insert_zc((ly_ctx *)ns,local_40);
      }
    }
  }
  return value_local;
}

Assistant:

static const char *
ident_val_add_module_prefix(const char *value, const struct lyxml_elem *xml, struct ly_ctx *ctx)
{
    const struct lyxml_ns *ns;
    const struct lys_module *mod;
    char *str;

    do {
        LY_TREE_FOR((struct lyxml_ns *)xml->attr, ns) {
            if ((ns->type == LYXML_ATTR_NS) && !ns->prefix) {
                /* match */
                break;
            }
        }
        if (!ns) {
            xml = xml->parent;
        }
    } while (!ns && xml);

    if (!ns) {
        /* no default namespace */
        LOGINT(ctx);
        return NULL;
    }

    /* find module */
    mod = ly_ctx_get_module_by_ns(ctx, ns->value, NULL, 1);
    if (!mod) {
        LOGINT(ctx);
        return NULL;
    }

    if (asprintf(&str, "%s:%s", mod->name, value) == -1) {
        LOGMEM(ctx);
        return NULL;
    }
    lydict_remove(ctx, value);

    return lydict_insert_zc(ctx, str);
}